

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O2

int __thiscall deci::ast_for_t::Generate(ast_for_t *this,ostream *output,int pc)

{
  string *psVar1;
  ast_item_t *paVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  undefined4 in_register_00000014;
  uint uVar6;
  
  iVar3 = (*this->start->_vptr_ast_item_t[2])(this->start,output,CONCAT44(in_register_00000014,pc));
  poVar5 = std::operator<<(output,"set ");
  psVar1 = &this->identifier;
  poVar5 = std::operator<<(poVar5,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar5);
  uVar6 = iVar3 + 1;
  poVar5 = std::operator<<(output,": __for_");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
  poVar5 = std::operator<<(poVar5,"__");
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar3 = (*this->finish->_vptr_ast_item_t[2])(this->finish,output,(ulong)uVar6);
  poVar5 = std::operator<<(output,"rval ");
  poVar5 = std::operator<<(poVar5,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(output,"bin gr");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(output,"jz __end_for_");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
  poVar5 = std::operator<<(poVar5,"__");
  std::endl<char,std::char_traits<char>>(poVar5);
  (this->super_ast_loop_t).end_loc_pos = uVar6;
  uVar4 = ast_t::Generate(this->loop,output,iVar3 + 3);
  paVar2 = this->step;
  if (paVar2 == (ast_item_t *)0x0) {
    poVar5 = std::operator<<(output,"push 1");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar3 = uVar4 + 1;
  }
  else {
    iVar3 = (*paVar2->_vptr_ast_item_t[2])(paVar2,output,(ulong)uVar4);
  }
  poVar5 = std::operator<<(output,"rval ");
  poVar5 = std::operator<<(poVar5,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(output,"bin sum");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(output,"set ");
  poVar5 = std::operator<<(poVar5,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(output,"jmp __for_");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
  poVar5 = std::operator<<(poVar5,"__");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(output,": __end_for_");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
  poVar5 = std::operator<<(poVar5,"__");
  std::endl<char,std::char_traits<char>>(poVar5);
  return iVar3 + 4;
}

Assistant:

int ast_for_t::Generate(std::ostream& output, int pc) const {
    pc = start->Generate(output, pc);

    output << "set " << this->identifier << std::endl;
    ++pc;

    int check_loc = pc;

    output << ": __for_" << check_loc << "__" << std::endl;

    pc = finish->Generate(output, pc);
    output << "rval " << this->identifier << std::endl;
    output << "bin gr" << std::endl;
    pc += 2;

    output << "jz __end_for_" << check_loc << "__" << std::endl;
    ++pc;

    this->end_loc_pos = check_loc;
    pc = loop->Generate(output, pc);

    if (this->step != nullptr) {
      pc = this->step->Generate(output, pc);
    }
    else {
      output << "push 1" << std::endl;
      ++pc;
    }
    output << "rval " << this->identifier << std::endl;
    output << "bin sum" << std::endl;
    output << "set " << this->identifier << std::endl;
    pc += 3;

    output << "jmp __for_" << check_loc << "__" << std::endl;
    ++pc;

    output << ": __end_for_" << check_loc << "__" << std::endl;

    return pc;
  }